

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

bool __thiscall
QTreeWidget::dropMimeData
          (QTreeWidget *this,QTreeWidgetItem *parent,int index,QMimeData *data,DropAction action)

{
  undefined1 uVar1;
  QAbstractItemModel *pQVar2;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.r = -1;
  local_40.c = -1;
  local_40.i = 0;
  local_40.m.ptr = (QAbstractItemModel *)0x0;
  if (parent != (QTreeWidgetItem *)0x0) {
    indexFromItem(&local_40,this,parent,0);
  }
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
  uVar1 = QAbstractItemModel::dropMimeData
                    ((QMimeData *)pQVar2,(DropAction)data,action,index,(QModelIndex *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidget::dropMimeData(QTreeWidgetItem *parent, int index,
                               const QMimeData *data, Qt::DropAction action)
{
    QModelIndex idx;
    if (parent) idx = indexFromItem(parent);
    return model()->QAbstractItemModel::dropMimeData(data, action , index, 0, idx);
}